

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O0

char * test_percentiles_by_value_at_percentiles(void)

{
  _Bool _Var1;
  int iVar2;
  double local_68;
  double percentiles [5];
  int64_t local_38;
  int64_t values [5];
  
  load_histograms();
  memset(&local_38,0,0x28);
  memset(&local_68,0,0x28);
  local_68 = 30.0;
  percentiles[0] = 99.0;
  percentiles[1] = 99.99;
  percentiles[2] = 99.999;
  percentiles[3] = 100.0;
  iVar2 = hdr_value_at_percentiles(raw_histogram,&local_68,&local_38,5);
  if (iVar2 == 0) {
    _Var1 = compare_percentile(local_38,1000.0,0.001);
    if (_Var1) {
      _Var1 = compare_percentile(values[0],1000.0,0.001);
      if (_Var1) {
        _Var1 = compare_percentile(values[1],1000.0,0.001);
        if (_Var1) {
          _Var1 = compare_percentile(values[2],100000000.0,0.001);
          if (_Var1) {
            _Var1 = compare_percentile(values[3],100000000.0,0.001);
            if (_Var1) {
              values[4] = 0;
            }
            else {
              values[4] = (int64_t)anon_var_dwarf_3ef;
            }
          }
          else {
            values[4] = (int64_t)anon_var_dwarf_3e5;
          }
        }
        else {
          values[4] = (int64_t)anon_var_dwarf_3cf;
        }
      }
      else {
        values[4] = (int64_t)anon_var_dwarf_3c5;
      }
    }
    else {
      values[4] = (int64_t)anon_var_dwarf_3bb;
    }
  }
  else {
    values[4] = (int64_t)anon_var_dwarf_42d;
  }
  return (char *)values[4];
}

Assistant:

static char* test_percentiles_by_value_at_percentiles(void)
{
    load_histograms();
    int64_t values[5] = { 0 };
    double percentiles[5] = { 30.0, 99.0, 99.99, 99.999, 100.0 };
    mu_assert(
        "value_at_percentiles return should be 0", hdr_value_at_percentiles(raw_histogram, percentiles, values, 5) == 0);
    mu_assert("Value at 30% not 1000.0", compare_percentile(values[0], 1000.0, 0.001));
    mu_assert("Value at 99% not 1000.0", compare_percentile(values[1], 1000.0, 0.001));
    mu_assert("Value at 99.99% not 1000.0", compare_percentile(values[2], 1000.0, 0.001));
    mu_assert("Value at 99.999% not 100000000.0", compare_percentile(values[3], 100000000.0, 0.001));
    mu_assert("Value at 100% not 100000000.0", compare_percentile(values[4], 100000000.0, 0.001));
    return 0;
}